

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O0

void __thiscall OpenMD::MinimizerParameters::~MinimizerParameters(MinimizerParameters *this)

{
  DataHolder *in_RDI;
  
  ((ParameterBase *)&in_RDI->_vptr_DataHolder)->_vptr_ParameterBase =
       (_func_int **)&PTR__MinimizerParameters_00523bf8;
  Parameter<double>::~Parameter((Parameter<double> *)0x2eab8d);
  Parameter<double>::~Parameter((Parameter<double> *)0x2eab9e);
  Parameter<double>::~Parameter((Parameter<double> *)0x2eabaf);
  Parameter<double>::~Parameter((Parameter<double> *)0x2eabc0);
  Parameter<int>::~Parameter((Parameter<int> *)0x2eabd1);
  Parameter<int>::~Parameter((Parameter<int> *)0x2eabe2);
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_RDI);
  Parameter<bool>::~Parameter((Parameter<bool> *)0x2eac01);
  DataHolder::~DataHolder(in_RDI);
  return;
}

Assistant:

void MinimizerParameters::validate() {
    CheckParameter(Method, isEqualIgnoreCase("SD") || isEqualIgnoreCase("CG") ||
                               isEqualIgnoreCase("BFGS"));
    CheckParameter(MaxIterations, isPositive());
    int one       = 1;
    int mi        = this->getMaxIterations();
    RealType zero = 0.0;
    RealType oneR = 1.0;
    CheckParameter(MaxStationaryStateIterations,
                   isGreaterThanOrEqualTo(one) && isLessThanOrEqualTo(mi));
    CheckParameter(RootEpsilon, isPositive());
    CheckParameter(GradientNormEpsilon, isPositive());
    CheckParameter(InitialStepSize,
                   isGreaterThan(zero) && isLessThanOrEqualTo(oneR));
  }